

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall FIX::Acceptor::block(Acceptor *this)

{
  bool bVar1;
  RuntimeError *this_00;
  allocator<char> local_31;
  string local_30;
  Acceptor *local_10;
  Acceptor *this_local;
  
  local_10 = this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_processing);
  if (!bVar1) {
    std::atomic<bool>::operator=(&this->m_processing,true);
    std::atomic<bool>::operator=(&this->m_stop,false);
    (*this->_vptr_Acceptor[2])(this,&this->m_settings);
    (*this->_vptr_Acceptor[3])(this,&this->m_settings);
    startThread(this);
    return;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Acceptor::block called when already processing messages",&local_31
            );
  RuntimeError::RuntimeError(this_00,&local_30);
  __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

EXCEPT(ConfigError, RuntimeError) {
  if (m_processing) {
    throw RuntimeError("Acceptor::block called when already processing messages");
  }

  m_processing = true;
  m_stop = false;
  onConfigure(m_settings);
  onInitialize(m_settings);

  startThread(this);
}